

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forms_compatability.cxx
# Opt level: O0

Fl_Button * fl_add_button(uchar t,int x,int y,int w,int h,char *l)

{
  Fl_Button *local_30;
  Fl_Button *b;
  char *l_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  uchar t_local;
  
  if (t == '\x04') {
    local_30 = (Fl_Button *)operator_new(0x80);
    Fl_Repeat_Button::Fl_Repeat_Button((Fl_Repeat_Button *)local_30,x,y,w,h,l);
  }
  else if (t == '\x06' || t == '\a') {
    local_30 = (Fl_Button *)operator_new(0x80);
    Fl_Return_Button::Fl_Return_Button((Fl_Return_Button *)local_30,x,y,w,h,l);
  }
  else {
    local_30 = (Fl_Button *)operator_new(0x80);
    Fl_Button::Fl_Button(local_30,x,y,w,h,l);
  }
  if (t == '\x01') {
LAB_0027f121:
    Fl_Widget::type(&local_30->super_Fl_Widget,t);
  }
  else {
    if (t != '\x03') {
      if (t == '\x05') {
        Fl_Widget::when(&local_30->super_Fl_Widget,'\x01');
        return local_30;
      }
      if (t != '\a') {
        if (t != 'f') {
          return local_30;
        }
        goto LAB_0027f121;
      }
    }
    Fl_Widget::type(&local_30->super_Fl_Widget,'\x03');
  }
  return local_30;
}

Assistant:

Fl_Button *fl_add_button(uchar t,int x,int y,int w,int h,const char *l) {
  Fl_Button *b;
  switch (t) {
  case FL_RETURN_BUTTON:
  case FL_HIDDEN_RET_BUTTON:
    b = new Fl_Return_Button(x,y,w,h,l);
    break;
  case FL_TOUCH_BUTTON:
    b = new Fl_Repeat_Button(x,y,w,h,l);
    break;
  default:
    b = new Fl_Button(x,y,w,h,l);
  }
  switch (t) {
  case FL_TOGGLE_BUTTON:
  case FL_RADIO_BUTTON:
    b->type(t);
    break;
  case FL_HIDDEN_BUTTON:
  case FL_HIDDEN_RET_BUTTON:
    b->type(FL_HIDDEN_BUTTON);
    break;
  case FL_INOUT_BUTTON:
    b->when(FL_WHEN_CHANGED);
    break;
  }
  return b;
}